

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

TPZStructMatrix * __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::Clone
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
           *this)

{
  TPZStructMatrix *pTVar1;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_> *result;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
  *in_stack_ffffffffffffffe8;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
  *in_stack_fffffffffffffff0;
  
  pTVar1 = (TPZStructMatrix *)operator_new(0xe8);
  TPZFrontStructMatrix(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return pTVar1;
}

Assistant:

TPZStructMatrix * TPZFrontStructMatrix<TFront,TVar,TPar>::Clone(){
	
	auto* result =  new TPZFrontStructMatrix<TFront,TVar,TPar>(*this);
	return result;
}